

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::iterate(AsyncCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  TestLog *log;
  Context *pCVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  _Self __tmp;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var9;
  pointer pTVar10;
  NotSupportedError *this_00;
  string *description;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *puVar11;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uint uVar12;
  long lVar13;
  uchar *tbs;
  size_t tbslen;
  long lVar14;
  deUint32 milliseconds;
  undefined8 *puVar15;
  ScopedLogSection section;
  GLint numMessages;
  DebugMessageTestContext context;
  ScopedLogSection local_230;
  ResultCollector *local_228;
  string local_220;
  undefined8 *local_200;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [6];
  ios_base local_180 [264];
  NegativeTestContext local_78;
  AsyncCase *local_38;
  long lVar8;
  
  bVar5 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (!bVar5) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x5bc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar6 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  log = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  pCVar3 = (this->super_BaseCase).super_ErrorCase.super_TestCase.m_context;
  local_228 = &(this->super_BaseCase).m_results;
  NegativeTestShared::NegativeTestContext::NegativeTestContext
            (&local_78,(ErrorCase *)this,pCVar3->m_renderCtx,pCVar3->m_contextInfo,log,local_228,
             true);
  local_1f8._0_8_ = (ulong)(uint)local_1f8._4_4_ << 0x20;
  local_38 = this;
  (**(code **)(lVar8 + 0x868))(0x9145);
  (**(code **)(lVar8 + 0x7e0))(local_1f8._0_8_ & 0xffffffff,0,0,0,0,0,0,0);
  (**(code **)(lVar8 + 0x5e0))(0x92e0);
  (**(code **)(lVar8 + 0x5e0))(0x8242);
  (**(code **)(lVar8 + 0x428))(0x1100,0x1100,0x1100,0,0,0);
  tbs = (uchar *)0x0;
  tbslen = 1;
  (**(code **)(lVar8 + 0x428))(0x8246,0x824c,0x1100,0);
  if (this->m_useCallbacks == true) {
    (**(code **)(lVar8 + 0x420))(BaseCase::callbackHandle,this);
  }
  else {
    (**(code **)(lVar8 + 0x420))(0,0);
  }
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"reference run","");
  paVar1 = &local_220.field_2;
  local_220._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"Reference run (synchronous)","");
  tcu::ScopedLogSection::ScopedLogSection(&local_230,log,(string *)local_1f8,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_,local_1e8[0]._M_allocated_capacity + 1);
  }
  pTVar10 = (this->m_errorFuncs).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_errorFuncs).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10) >> 4)) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      iVar6 = *(int *)((long)pTVar10 + lVar14 + -8);
      pcVar4 = *(code **)((long)&pTVar10->m_type + lVar14);
      if (iVar6 == 2) {
        (*pcVar4)(&local_78);
      }
      else if (iVar6 == 1) {
        (*pcVar4)(&local_78);
      }
      lVar13 = lVar13 + 1;
      pTVar10 = (this->m_errorFuncs).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < (int)((ulong)((long)(this->m_errorFuncs).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10
                                   ) >> 4));
  }
  tcu::TestLog::endSection(local_230.m_log);
  if ((this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar12 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[2])();
    if ((uVar12 >> 0xb & 1) == 0) {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "Need debug context to guarantee implementation behaviour (see command line options)"
                 ,"");
      tcu::ResultCollector::addResult(local_228,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1f8);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1e8[0]._M_allocated_capacity + 1);
      }
    }
    poVar2 = (ostringstream *)(local_1f8 + 8);
    local_1f8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference run produced no messages, nothing to verify",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_180);
    (**(code **)(lVar8 + 0x420))(0,0);
    puVar15 = (undefined8 *)(lVar8 + 0x4e8);
  }
  else {
    for (p_Var9 = (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->m_counts)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      *(undefined4 *)&p_Var9[1]._M_left = *(undefined4 *)((long)&p_Var9[1]._M_parent + 4);
      *(undefined4 *)((long)&p_Var9[1]._M_parent + 4) = 0;
    }
    (**(code **)(lVar8 + 0x4e8))(0x8242);
    pTVar10 = (this->m_errorFuncs).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_errorFuncs).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10) >> 4)) {
      lVar14 = 8;
      lVar13 = 0;
      do {
        iVar6 = *(int *)((long)pTVar10 + lVar14 + -8);
        pcVar4 = *(code **)((long)&pTVar10->m_type + lVar14);
        if (iVar6 == 2) {
          (*pcVar4)(&local_78);
        }
        else if (iVar6 == 1) {
          (*pcVar4)(&local_78);
        }
        lVar13 = lVar13 + 1;
        pTVar10 = (this->m_errorFuncs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x10;
      } while (lVar13 < (int)((ulong)((long)(this->m_errorFuncs).
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar10) >> 4));
    }
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"result run","");
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"Result run (asynchronous)","");
    description = &local_220;
    tcu::ScopedLogSection::ScopedLogSection(&local_230,log,(string *)local_1f8,description);
    puVar11 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      puVar11 = extraout_RDX_00;
    }
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1e8[0]._M_allocated_capacity + 1);
      puVar11 = extraout_RDX_01;
    }
    local_200 = (undefined8 *)(lVar8 + 0x4e8);
    iVar6 = 2;
    uVar12 = 0;
LAB_0036fa3c:
    iVar7 = verify(this,(EVP_PKEY_CTX *)0x0,puVar11,(size_t)description,tbs,tbslen);
    milliseconds = uVar12 >> 2;
    if (milliseconds < 0x33) {
      milliseconds = 0x32;
    }
    if (iVar7 == 0) {
      iVar7 = 0;
      puVar11 = extraout_RDX_02;
LAB_0036fb83:
      verify(this,(EVP_PKEY_CTX *)&DAT_00000001,puVar11,(size_t)description,tbs,tbslen);
      if ((99 < uVar12) && (iVar6 != iVar7)) {
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Async messages were returned to application somewhat slowly"
                   ,"");
        tcu::ResultCollector::addResult
                  (local_228,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1f8);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1e8[0]._M_allocated_capacity + 1);
        }
      }
      poVar2 = (ostringstream *)(local_1f8 + 8);
      local_1f8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Passed after ~",0xe);
      std::ostream::operator<<(poVar2,uVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ms of waiting",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_180);
      puVar15 = local_200;
      goto LAB_0036fd3b;
    }
    description = (string *)CONCAT71((int7)((ulong)description >> 8),iVar7 == 1);
    bVar5 = 9999 < uVar12 && iVar7 == 1;
    puVar11 = (uchar *)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),bVar5);
    if (bVar5) {
      iVar7 = 1;
      goto LAB_0036fb83;
    }
    if (uVar12 < 10000) {
      if (uVar12 < 100) {
        iVar6 = iVar7;
      }
      deSleep(milliseconds);
      uVar12 = uVar12 + milliseconds;
      puVar11 = extraout_RDX_03;
      if (this->m_useCallbacks == false) {
        fetchLogMessages(this);
        puVar11 = extraout_RDX_04;
      }
      goto LAB_0036fa3c;
    }
    verify(this,(EVP_PKEY_CTX *)&DAT_00000001,puVar11,(size_t)description,tbs,tbslen);
    poVar2 = (ostringstream *)(local_1f8 + 8);
    local_1f8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Waited for ~",0xc);
    std::ostream::operator<<(poVar2,uVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"ms without getting all expected messages",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_180);
    local_1f8._0_8_ = (TestLog *)(local_1f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Async messages were not returned to application within a reasonable timeframe","");
    tcu::ResultCollector::addResult(local_228,QP_TEST_RESULT_FAIL,(string *)local_1f8);
    puVar15 = local_200;
    if ((TestLog *)local_1f8._0_8_ != (TestLog *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,local_1e8[0]._M_allocated_capacity + 1);
    }
LAB_0036fd3b:
    tcu::TestLog::endSection(local_230.m_log);
    (**(code **)(lVar8 + 0x420))(0,0);
  }
  (*(code *)*puVar15)(0x92e0);
  tcu::ResultCollector::setTestContextResult
            (local_228,
             (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  NegativeTestShared::NegativeTestContext::~NegativeTestContext(&local_78);
  return STOP;
}

Assistant:

AsyncCase::IterateResult AsyncCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log			= m_testCtx.getLog();
	DebugMessageTestContext	context		= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);
	const int				maxWait		= 10000; // ms
	const int				warnWait	= 100;

	// Clear log from earlier messages
	{
		GLint numMessages = 0;
		gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMessages);
		gl.getDebugMessageLog(numMessages, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL);
	}

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, false);

	// Some messages could be dependent on the value of DEBUG_OUTPUT_SYNCHRONOUS so only use API errors which should be generated in all cases
	gl.debugMessageControl(GL_DEBUG_SOURCE_API, GL_DEBUG_TYPE_ERROR, GL_DONT_CARE, 0, DE_NULL, true);

	if (m_useCallbacks) // will use log otherwise
		gl.debugMessageCallback(callbackHandle, this);
	else
		gl.debugMessageCallback(DE_NULL, DE_NULL);

	// Reference run (synchoronous)
	{
		tcu::ScopedLogSection section(log, "reference run", "Reference run (synchronous)");

		for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
			m_errorFuncs[ndx].call(context);
	}

	if (m_counts.empty())
	{
		if (!isDebugContext())
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Need debug context to guarantee implementation behaviour (see command line options)");

		log << TestLog::Message << "Reference run produced no messages, nothing to verify" << TestLog::EndMessage;

		gl.debugMessageCallback(DE_NULL, DE_NULL);
		gl.disable(GL_DEBUG_OUTPUT);

		m_results.setTestContextResult(m_testCtx);
		return STOP;
	}

	for (MessageCounter::iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		itr->second.expected = itr->second.received;
		itr->second.received = 0;
	}

	gl.disable(GL_DEBUG_OUTPUT_SYNCHRONOUS);

	// Result run (async)
	for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
		m_errorFuncs[ndx].call(context);

	// Repatedly try verification, new results may be added to m_receivedMessages at any time
	{
		tcu::ScopedLogSection	section			(log, "result run", "Result run (asynchronous)");
		VerifyState				lastTimelyState = VERIFY_FAIL;

		for (int waited = 0;;)
		{
			const VerifyState	pass = verify(false);
			const int			wait = de::max(50, waited>>2);

			// Pass (possibly due to time limit)
			if (pass == VERIFY_PASS || (pass == VERIFY_MINIMUM && waited >= maxWait))
			{
				verify(true); // log

				// State changed late
				if (waited >= warnWait && lastTimelyState != pass)
					m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Async messages were returned to application somewhat slowly");

				log << TestLog::Message << "Passed after ~" << waited << "ms of waiting" << TestLog::EndMessage;
				break;
			}
			// fail
			else if (waited >= maxWait)
			{
				verify(true); // log

				log << TestLog::Message << "Waited for ~" << waited << "ms without getting all expected messages" << TestLog::EndMessage;
				m_results.addResult(QP_TEST_RESULT_FAIL, "Async messages were not returned to application within a reasonable timeframe");
				break;
			}

			if (waited < warnWait)
				lastTimelyState = pass;

			deSleep(wait);
			waited += wait;

			if (!m_useCallbacks)
				fetchLogMessages();
		}
	}

	gl.debugMessageCallback(DE_NULL, DE_NULL);

	gl.disable(GL_DEBUG_OUTPUT);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}